

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsymtab.c
# Opt level: O0

D_Sym * update_additional_D_Sym(D_Scope *st,D_Sym *sym,int sizeof_D_Sym)

{
  D_Sym *__dest;
  D_Sym *s;
  D_Sym *pDStack_18;
  int sizeof_D_Sym_local;
  D_Sym *sym_local;
  D_Scope *st_local;
  
  pDStack_18 = current_D_Sym(st,sym);
  __dest = (D_Sym *)malloc((long)sizeof_D_Sym);
  memcpy(__dest,pDStack_18,0x30);
  if (pDStack_18->update_of != (D_Sym *)0x0) {
    pDStack_18 = pDStack_18->update_of;
  }
  __dest->update_of = pDStack_18;
  __dest->next = st->updates;
  st->updates = __dest;
  return __dest;
}

Assistant:

D_Sym *update_additional_D_Sym(D_Scope *st, D_Sym *sym, int sizeof_D_Sym) {
  D_Sym *s;

  sym = current_D_Sym(st, sym);
  s = MALLOC(sizeof_D_Sym);
  memcpy(s, sym, sizeof(D_Sym));
  if (sym->update_of) sym = sym->update_of;
  s->update_of = sym;
  s->next = st->updates;
  st->updates = s;
  return s;
}